

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O0

void __thiscall QToolButton::enterEvent(QToolButton *this,QEnterEvent *e)

{
  QToolButtonPrivate *pQVar1;
  QEnterEvent *in_RSI;
  QWidget *in_RDI;
  QToolButtonPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QToolButton *)0x70a411);
  if (((byte)pQVar1->field_0x2ec >> 3 & 1) != 0) {
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  if (pQVar1->defaultAction != (QAction *)0x0) {
    QAction::hover((QAction *)0x70a458);
  }
  QWidget::enterEvent(in_RDI,in_RSI);
  return;
}

Assistant:

void QToolButton::enterEvent(QEnterEvent * e)
{
    Q_D(QToolButton);
    if (d->autoRaise)
        update();
    if (d->defaultAction)
        d->defaultAction->hover();
    QAbstractButton::enterEvent(e);
}